

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_poll.c
# Opt level: O2

int main(void)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  tnt_stream *ptVar3;
  tnt_reply *r;
  int *piVar4;
  long lVar5;
  uint uVar6;
  size_t sStack_40d0;
  undefined8 local_40c8 [2048];
  char acStack_c8 [8];
  char uri [128];
  
  plan(1);
  plan(1);
  __space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"*** %s: prep ***","test_poll");
  fputc(10,_stdout);
  uri[0x68] = '\0';
  uri[0x69] = '\0';
  uri[0x6a] = '\0';
  uri[0x6b] = '\0';
  uri[0x6c] = '\0';
  uri[0x6d] = '\0';
  uri[0x6e] = '\0';
  uri[0x6f] = '\0';
  uri[0x70] = '\0';
  uri[0x71] = '\0';
  uri[0x72] = '\0';
  uri[0x73] = '\0';
  uri[0x74] = '\0';
  uri[0x75] = '\0';
  uri[0x76] = '\0';
  uri[0x77] = '\0';
  uri[0x58] = '\0';
  uri[0x59] = '\0';
  uri[0x5a] = '\0';
  uri[0x5b] = '\0';
  uri[0x5c] = '\0';
  uri[0x5d] = '\0';
  uri[0x5e] = '\0';
  uri[0x5f] = '\0';
  uri[0x60] = '\0';
  uri[0x61] = '\0';
  uri[0x62] = '\0';
  uri[99] = '\0';
  uri[100] = '\0';
  uri[0x65] = '\0';
  uri[0x66] = '\0';
  uri[0x67] = '\0';
  uri[0x48] = '\0';
  uri[0x49] = '\0';
  uri[0x4a] = '\0';
  uri[0x4b] = '\0';
  uri[0x4c] = '\0';
  uri[0x4d] = '\0';
  uri[0x4e] = '\0';
  uri[0x4f] = '\0';
  uri[0x50] = '\0';
  uri[0x51] = '\0';
  uri[0x52] = '\0';
  uri[0x53] = '\0';
  uri[0x54] = '\0';
  uri[0x55] = '\0';
  uri[0x56] = '\0';
  uri[0x57] = '\0';
  uri[0x38] = '\0';
  uri[0x39] = '\0';
  uri[0x3a] = '\0';
  uri[0x3b] = '\0';
  uri[0x3c] = '\0';
  uri[0x3d] = '\0';
  uri[0x3e] = '\0';
  uri[0x3f] = '\0';
  uri[0x40] = '\0';
  uri[0x41] = '\0';
  uri[0x42] = '\0';
  uri[0x43] = '\0';
  uri[0x44] = '\0';
  uri[0x45] = '\0';
  uri[0x46] = '\0';
  uri[0x47] = '\0';
  uri[0x28] = '\0';
  uri[0x29] = '\0';
  uri[0x2a] = '\0';
  uri[0x2b] = '\0';
  uri[0x2c] = '\0';
  uri[0x2d] = '\0';
  uri[0x2e] = '\0';
  uri[0x2f] = '\0';
  uri[0x30] = '\0';
  uri[0x31] = '\0';
  uri[0x32] = '\0';
  uri[0x33] = '\0';
  uri[0x34] = '\0';
  uri[0x35] = '\0';
  uri[0x36] = '\0';
  uri[0x37] = '\0';
  uri[0x18] = '\0';
  uri[0x19] = '\0';
  uri[0x1a] = '\0';
  uri[0x1b] = '\0';
  uri[0x1c] = '\0';
  uri[0x1d] = '\0';
  uri[0x1e] = '\0';
  uri[0x1f] = '\0';
  uri[0x20] = '\0';
  uri[0x21] = '\0';
  uri[0x22] = '\0';
  uri[0x23] = '\0';
  uri[0x24] = '\0';
  uri[0x25] = '\0';
  uri[0x26] = '\0';
  uri[0x27] = '\0';
  uri[8] = '\0';
  uri[9] = '\0';
  uri[10] = '\0';
  uri[0xb] = '\0';
  uri[0xc] = '\0';
  uri[0xd] = '\0';
  uri[0xe] = '\0';
  uri[0xf] = '\0';
  uri[0x10] = '\0';
  uri[0x11] = '\0';
  uri[0x12] = '\0';
  uri[0x13] = '\0';
  uri[0x14] = '\0';
  uri[0x15] = '\0';
  uri[0x16] = '\0';
  uri[0x17] = '\0';
  acStack_c8[0] = '\0';
  acStack_c8[1] = '\0';
  acStack_c8[2] = '\0';
  acStack_c8[3] = '\0';
  acStack_c8[4] = '\0';
  acStack_c8[5] = '\0';
  acStack_c8[6] = '\0';
  acStack_c8[7] = '\0';
  uri[0] = '\0';
  uri[1] = '\0';
  uri[2] = '\0';
  uri[3] = '\0';
  uri[4] = '\0';
  uri[5] = '\0';
  uri[6] = '\0';
  uri[7] = '\0';
  pcVar2 = getenv("LISTEN");
  snprintf(acStack_c8,0x80,"test:test@%s",pcVar2);
  memset(local_40c8,0,0x4000);
  lVar5 = 0;
  do {
    if (lVar5 == 0x800) {
      uVar6 = 0x7ff;
LAB_00104591:
      iVar1 = __ok((uint)(lVar5 == 0x800),"expected non-assert test");
      if (iVar1 == 0) {
        __space((FILE *)_stderr);
        fwrite("#   Failed test \'",0x11,1,_stderr);
        fwrite("expected non-assert test",0x18,1,_stderr);
        fwrite("\'\n",2,1,_stderr);
        __space((FILE *)_stderr);
        fprintf(_stderr,"#   in %s at line %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_poll.c"
                ,0x60);
      }
      for (; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
        ptVar3 = (tnt_stream *)local_40c8[uVar6];
        if (ptVar3 != (tnt_stream *)0x0) {
          tnt_close(ptVar3);
          tnt_stream_free(ptVar3);
        }
      }
      check_plan();
      return 0;
    }
    ptVar3 = tnt_net((tnt_stream *)0x0);
    if (ptVar3 == (tnt_stream *)0x0) {
      __assert_fail("tnt != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/test/cli/tarantool_poll.c"
                    ,0x26,"int test_poll()");
    }
    iVar1 = tnt_set(ptVar3,0,acStack_c8);
    uVar6 = (uint)lVar5;
    if (iVar1 != 0) {
      pcVar2 = "failed to set uri\n";
      sStack_40d0 = 0x12;
LAB_0010457c:
      fwrite(pcVar2,sStack_40d0,1,_stderr);
LAB_00104585:
      tnt_stream_free(ptVar3);
      uVar6 = uVar6 - 1;
      goto LAB_00104591;
    }
    iVar1 = tnt_set(ptVar3,7,0);
    if (iVar1 != 0) {
      pcVar2 = "failed to set sendbuf size\n";
      sStack_40d0 = 0x1b;
      goto LAB_0010457c;
    }
    iVar1 = tnt_set(ptVar3,10,0);
    if (iVar1 != 0) {
      pcVar2 = "failed to set rcvbuf size\n";
      sStack_40d0 = 0x1a;
      goto LAB_0010457c;
    }
    uri[0x78] = '\n';
    uri[0x79] = '\0';
    uri[0x7a] = '\0';
    uri[0x7b] = '\0';
    uri[0x7c] = '\0';
    uri[0x7d] = '\0';
    uri[0x7e] = '\0';
    uri[0x7f] = '\0';
    iVar1 = tnt_set(ptVar3,1,uri + 0x78);
    if (iVar1 != 0) {
      pcVar2 = "failed to set timeout connect\n";
      sStack_40d0 = 0x1e;
      goto LAB_0010457c;
    }
    iVar1 = tnt_connect(ptVar3);
    if (iVar1 != 0) {
      __space((FILE *)_stderr);
      fwrite("# ",2,1,_stderr);
      __stream = _stderr;
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      fprintf(__stream,"tnt_connect: %s",pcVar2);
      fputc(10,_stderr);
      goto LAB_00104585;
    }
    local_40c8[lVar5] = ptVar3;
    tnt_ping(ptVar3);
    tnt_flush(ptVar3);
    r = tnt_reply_init((tnt_reply *)0x0);
    iVar1 = (*ptVar3->read_reply)(ptVar3,r);
    if (iVar1 != 0) {
      fwrite("failed to read reply\n",0x15,1,_stderr);
      goto LAB_00104591;
    }
    tnt_reply_free(r);
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int main()
{
	plan(1);

	test_poll();

	return 0;
}